

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eccommit_impl.h
# Opt level: O2

int secp256k1_ec_commit_tweak
              (uchar *tweak32,secp256k1_ge *pubp,secp256k1_sha256 *sha,uchar *data,size_t data_size)

{
  uchar rbuf [33];
  
  if (pubp->infinity != 0) {
    return 0;
  }
  secp256k1_fe_normalize(&pubp->x);
  secp256k1_fe_normalize(&pubp->y);
  secp256k1_fe_get_b32(rbuf + 1,&pubp->x);
  rbuf[0] = (byte)(pubp->y).n[0] & 1 | 2;
  secp256k1_sha256_write(sha,rbuf,0x21);
  secp256k1_sha256_write(sha,data,0x20);
  secp256k1_sha256_finalize(sha,tweak32);
  return 1;
}

Assistant:

static int secp256k1_ec_commit_tweak(unsigned char *tweak32, secp256k1_ge* pubp, secp256k1_sha256* sha, const unsigned char *data, size_t data_size)
{
    unsigned char rbuf[33];

    if (!secp256k1_ec_commit_pubkey_serialize_const(pubp, rbuf)) {
        return 0;
    }
    secp256k1_sha256_write(sha, rbuf, sizeof(rbuf));
    secp256k1_sha256_write(sha, data, data_size);
    secp256k1_sha256_finalize(sha, tweak32);
    return 1;
}